

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,unsigned_int>::
IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul>>::AdvanceIfEnd<2ul>
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  bool bVar1;
  ParamIterator<libaom_test::TestMode> *this_00;
  size_t NextI;
  bool last;
  ParamIterator<unsigned_int> *in_stack_ffffffffffffffc8;
  ParamIterator<unsigned_int> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  
  std::
  get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
              *)0x7ae4bc);
  std::
  get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
              *)0x7ae4cf);
  bVar1 = ParamIterator<unsigned_int>::operator!=
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (!bVar1) {
    uVar2 = 0;
    this_00 = (ParamIterator<libaom_test::TestMode> *)
              std::
              get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
                        ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
                          *)0x7ae509);
    std::
    get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
                *)0x7ae51c);
    ParamIterator<unsigned_int>::operator=
              ((ParamIterator<unsigned_int> *)this_00,in_stack_ffffffffffffffc8);
    std::
    get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<unsigned_int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<unsigned_int>_>
                *)0x7ae537);
    ParamIterator<libaom_test::TestMode>::operator++(this_00);
    AdvanceIfEnd<1ul>((IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *)
                      CONCAT17(uVar2,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }